

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

Hop_Man_t * Abc_NtkPartStartHop(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  Hop_Man_t *p;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Abc_Obj_t *pAVar9;
  Hop_Obj_t *pHVar10;
  char *__assertion;
  Abc_Obj_t *pAVar11;
  long lVar12;
  
  p = Hop_ManStart();
  uVar1 = pNtk->vObjs->nSize;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < uVar1) {
    iVar6 = uVar1 + 1;
  }
  pVVar7->nCap = iVar6;
  if (iVar6 == 0) {
    p->vObjs = pVVar7;
    pAVar11 = (Abc_Obj_t *)p->pConst1;
    ppvVar8 = (void **)malloc(0x80);
    pVVar7->pArray = ppvVar8;
    pVVar7->nCap = 0x10;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar6 << 3);
    pVVar7->pArray = ppvVar8;
    p->vObjs = pVVar7;
    pAVar11 = (Abc_Obj_t *)p->pConst1;
  }
  pVVar7->nSize = 1;
  *ppvVar8 = pAVar11;
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->pNext = pAVar11;
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar12];
      pHVar10 = Hop_ObjCreatePi(p);
      *(Hop_Obj_t **)((long)pvVar2 + 8) = pHVar10;
      lVar12 = lVar12 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar12 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      puVar3 = (undefined8 *)pVVar7->pArray[lVar12];
      if (puVar3 != (undefined8 *)0x0) {
        if (((ulong)puVar3 & 1) != 0) goto LAB_002ec079;
        if (*(int *)*puVar3 != 3) goto LAB_002ec070;
        if (*(int *)((long)puVar3 + 0x1c) == 2) {
          lVar4 = *(long *)(*(long *)((int *)*puVar3 + 8) + 8);
          pHVar10 = Hop_And(p,(Hop_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar3 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar4 + (long)*(int *)puVar3[4] * 8) + 8)),
                            (Hop_Obj_t *)
                            ((ulong)(*(uint *)((long)puVar3 + 0x14) >> 0xb & 1) ^
                            *(ulong *)(*(long *)(lVar4 + (long)((int *)puVar3[4])[1] * 8) + 8)));
          puVar3[1] = pHVar10;
          if (((ulong)pHVar10 & 1) != 0) {
            __assert_fail("!Abc_ObjIsComplement(pObj->pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                          ,0x3cc,"Hop_Man_t *Abc_NtkPartStartHop(Abc_Ntk_t *)");
          }
          pVVar7 = pNtk->vObjs;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
    if (0 < pVVar7->nSize) {
      lVar12 = 0;
      do {
        puVar3 = (undefined8 *)pVVar7->pArray[lVar12];
        if (puVar3 != (undefined8 *)0x0) {
          if (((ulong)puVar3 & 1) != 0) goto LAB_002ec079;
          if (*(int *)*puVar3 != 3) goto LAB_002ec070;
          if ((*(int *)((long)puVar3 + 0x1c) == 2) && (puVar3[8] != 0)) {
            *(undefined8 *)puVar3[1] = *(undefined8 *)(puVar3[8] + 8);
            pVVar7 = pNtk->vObjs;
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar7->nSize);
    }
  }
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      plVar5 = (long *)pVVar7->pArray[lVar12];
      Hop_ObjCreatePo(p,(Hop_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                            (long)*(int *)plVar5[4] * 8) + 8)));
      lVar12 = lVar12 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar12 < pVVar7->nSize);
  }
  iVar6 = Hop_ManCheck(p);
  if (iVar6 == 0) {
    puts("Abc_NtkPartStartHop: HOP manager check has failed.");
  }
  return p;
LAB_002ec079:
  __assertion = "!Abc_ObjIsComplement(pNode)";
  goto LAB_002ec080;
LAB_002ec070:
  __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_002ec080:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

Hop_Man_t * Abc_NtkPartStartHop( Abc_Ntk_t * pNtk )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj;
    int i;
    // start the HOP package
    pMan = Hop_ManStart();
    pMan->vObjs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) + 1  );
    Vec_PtrPush( pMan->vObjs, Hop_ManConst1(pMan) );
    // map constant node and PIs
    Abc_AigConst1(pNtk)->pNext = (Abc_Obj_t *)Hop_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)Hop_ObjCreatePi(pMan);
    // map the internal nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        pObj->pNext = (Abc_Obj_t *)Hop_And( pMan, Hop_ObjChild0Next(pObj), Hop_ObjChild1Next(pObj) );
        assert( !Abc_ObjIsComplement(pObj->pNext) );
    }
    // set the choice nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        if ( pObj->pCopy )
            ((Hop_Obj_t *)pObj->pNext)->pData = pObj->pCopy->pNext;
    }
    // transfer the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Hop_ObjCreatePo( pMan, Hop_ObjChild0Next(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pMan) )
        printf( "Abc_NtkPartStartHop: HOP manager check has failed.\n" );
    return pMan;
}